

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O2

void helper_retry_sparc64(CPUSPARCState_conflict1 *env)

{
  uint64_t uVar1;
  trap_state *ptVar2;
  uint uVar3;
  
  ptVar2 = cpu_tsptr_sparc64(env);
  uVar1 = ptVar2->tnpc;
  env->pc = ptVar2->tpc;
  env->npc = uVar1;
  uVar1 = ptVar2->tstate;
  uVar3 = (uint)(uVar1 >> 0x20);
  env->xcc = (uVar3 & 0xfffffff0) << 0x10;
  env->psr = (uVar3 & 0xf) << 0x14;
  env->cc_op = 1;
  env->asi = (uint)(uVar1 >> 0x18) & 0xff;
  cpu_change_pstate_sparc64(env,(uint)uVar1 >> 8 & 0xf3f);
  cpu_put_cwp64_sparc64(env,(uint)(byte)ptVar2->tstate);
  if (((env->def).features & 0x800) != 0) {
    uVar3 = (uint)(ptVar2->tstate >> 0x28) & 7;
    env->hpstate = env->htstate[env->tl];
    cpu_gl_switch_gregs_sparc64(env,uVar3);
    env->gl = uVar3;
  }
  env->tl = env->tl - 1;
  return;
}

Assistant:

void helper_retry(CPUSPARCState *env)
{
    trap_state *tsptr = cpu_tsptr(env);

    env->pc = tsptr->tpc;
    env->npc = tsptr->tnpc;
    cpu_put_ccr(env, tsptr->tstate >> 32);
    env->asi = (tsptr->tstate >> 24) & 0xff;
    cpu_change_pstate(env, (tsptr->tstate >> 8) & 0xf3f);
    cpu_put_cwp64(env, tsptr->tstate & 0xff);
    if (cpu_has_hypervisor(env)) {
        uint32_t new_gl = (tsptr->tstate >> 40) & 7;
        env->hpstate = env->htstate[env->tl];
        cpu_gl_switch_gregs(env, new_gl);
        env->gl = new_gl;
    }
    env->tl--;

    if (cpu_interrupts_enabled(env)) {
        // cpu_check_irqs(env);
    }
}